

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O2

void __thiscall
BufferInputSource::BufferInputSource(BufferInputSource *this,string *description,string *contents)

{
  Buffer *this_00;
  longlong lVar1;
  uchar *__dest;
  size_t local_28;
  
  (this->super_InputSource).last_offset = 0;
  (this->super_InputSource).buf_len = 0;
  (this->super_InputSource).buf_idx = 0;
  (this->super_InputSource).buf_start = 0;
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__BufferInputSource_002abd10;
  this->own_memory = true;
  std::__cxx11::string::string((string *)&this->description,(string *)description);
  this_00 = (Buffer *)operator_new(8);
  Buffer::Buffer(this_00,contents->_M_string_length);
  this->buf = this_00;
  this->cur_offset = 0;
  local_28 = Buffer::getSize(this_00);
  lVar1 = QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_28);
  this->max_offset = lVar1;
  __dest = Buffer::getBuffer(this->buf);
  memcpy(__dest,(contents->_M_dataplus)._M_p,contents->_M_string_length);
  return;
}

Assistant:

BufferInputSource::BufferInputSource(std::string const& description, std::string const& contents) :
    own_memory(true),
    description(description),
    buf(new Buffer(contents.length())),
    cur_offset(0),
    max_offset(QIntC::to_offset(buf->getSize()))
{
    memcpy(buf->getBuffer(), contents.c_str(), contents.length());
}